

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::handler_successful_return_struct_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_function *tfunc)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  t_type *ptVar4;
  t_struct *ptVar5;
  members_type *__x;
  reference pptVar6;
  string local_230;
  t_field *local_210;
  t_field *xception_field;
  t_field **local_200;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_1f8
  ;
  const_iterator members_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  t_struct *txceptions;
  string local_1c0;
  undefined1 local_1a0 [8];
  ostringstream return_struct;
  int member_count;
  t_function *tfunc_local;
  t_rs_generator *this_local;
  
  return_struct._372_4_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  service_call_result_struct_name_abi_cxx11_(&local_1c0,this,tfunc);
  poVar3 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  std::operator<<(poVar3," { ");
  std::__cxx11::string::~string((string *)&local_1c0);
  ptVar4 = t_function::get_returntype(tfunc);
  uVar2 = (*(ptVar4->super_t_doc)._vptr_t_doc[4])();
  if ((uVar2 & 1) == 0) {
    std::operator<<((ostream *)local_1a0,"result_value: Some(handler_return)");
    return_struct._372_4_ = return_struct._372_4_ + 1;
  }
  ptVar5 = t_function::get_xceptions(tfunc);
  if (ptVar5 != (t_struct *)0x0) {
    ptVar5 = t_function::get_xceptions(tfunc);
    __x = t_struct::get_sorted_members(ptVar5);
    std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
              ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter,__x);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_1f8);
    local_200 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter);
    local_1f8._M_current = local_200;
    while( true ) {
      xception_field =
           (t_field *)
           std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                     ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1f8,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&xception_field);
      if (!bVar1) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_1f8);
      local_210 = *pptVar6;
      if (0 < (int)return_struct._372_4_) {
        std::operator<<((ostream *)local_1a0,", ");
      }
      rust_field_name_abi_cxx11_(&local_230,this,local_210);
      poVar3 = std::operator<<((ostream *)local_1a0,(string *)&local_230);
      std::operator<<(poVar3,": None");
      std::__cxx11::string::~string((string *)&local_230);
      return_struct._372_4_ = return_struct._372_4_ + 1;
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_1f8);
    }
    std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
              ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter);
  }
  std::operator<<((ostream *)local_1a0," }");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::handler_successful_return_struct(t_function* tfunc) {
  int member_count = 0;
  ostringstream return_struct;

  return_struct << service_call_result_struct_name(tfunc) << " { ";

  // actual return
  if (!tfunc->get_returntype()->is_void()) {
    return_struct << "result_value: Some(handler_return)";
    member_count++;
  }

  // any user-defined exceptions
  if (tfunc->get_xceptions() != nullptr) {
    t_struct* txceptions = tfunc->get_xceptions();
    const vector<t_field*> members = txceptions->get_sorted_members();
    vector<t_field*>::const_iterator members_iter;
    for (members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field* xception_field = (*members_iter);
      if (member_count > 0) { return_struct << ", "; }
      return_struct << rust_field_name(xception_field) << ": None";
      member_count++;
    }
  }

  return_struct << " }";

  return  return_struct.str();
}